

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_pmeth.c
# Opt level: O0

int pkey_ec_ctrl_str(EVP_PKEY_CTX *ctx,char *type,char *value)

{
  int iVar1;
  EVP_PKEY_CTX *ctx_00;
  char *in_RDX;
  char *in_RSI;
  int co_mode;
  EVP_MD *md;
  int param_enc;
  int nid;
  int in_stack_00000084;
  EVP_PKEY_CTX *in_stack_00000088;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  EVP_PKEY_CTX *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  int local_4;
  
  iVar1 = strcmp(in_RSI,"ec_paramgen_curve");
  if (iVar1 == 0) {
    iVar1 = EC_curve_nist2nid((char *)0x3dab87);
    if (iVar1 == 0) {
      iVar1 = OBJ_sn2nid(in_RDX);
    }
    if (iVar1 == 0) {
      iVar1 = OBJ_ln2nid(in_RDX);
    }
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug(in_RDX,iVar1,(char *)in_stack_ffffffffffffffd0);
      ERR_set_error(0x10,0x8d,(char *)0x0);
      local_4 = 0;
    }
    else {
      local_4 = EVP_PKEY_CTX_set_ec_paramgen_curve_nid
                          (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
  }
  else {
    iVar1 = strcmp(in_RSI,"ec_param_enc");
    if (iVar1 == 0) {
      iVar1 = strcmp(in_RDX,"explicit");
      if ((iVar1 == 0) || (iVar1 = strcmp(in_RDX,"named_curve"), iVar1 == 0)) {
        local_4 = EVP_PKEY_CTX_set_ec_param_enc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
        ;
      }
      else {
        local_4 = -2;
      }
    }
    else {
      iVar1 = strcmp(in_RSI,"ecdh_kdf_md");
      if (iVar1 == 0) {
        ctx_00 = (EVP_PKEY_CTX *)EVP_get_digestbyname(in_RDX);
        if (ctx_00 == (EVP_PKEY_CTX *)0x0) {
          ERR_new();
          ERR_set_debug(in_RDX,in_stack_ffffffffffffffdc,(char *)ctx_00);
          ERR_set_error(0x10,0x97,(char *)0x0);
          local_4 = 0;
        }
        else {
          local_4 = EVP_PKEY_CTX_set_ecdh_kdf_md
                              (ctx_00,(EVP_MD *)
                                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
          ;
        }
      }
      else {
        iVar1 = strcmp(in_RSI,"ecdh_cofactor_mode");
        if (iVar1 == 0) {
          atoi(in_RDX);
          local_4 = EVP_PKEY_CTX_set_ecdh_cofactor_mode(in_stack_00000088,in_stack_00000084);
        }
        else {
          local_4 = -2;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int pkey_ec_ctrl_str(EVP_PKEY_CTX *ctx,
                            const char *type, const char *value)
{
    if (strcmp(type, "ec_paramgen_curve") == 0) {
        int nid;
        nid = EC_curve_nist2nid(value);
        if (nid == NID_undef)
            nid = OBJ_sn2nid(value);
        if (nid == NID_undef)
            nid = OBJ_ln2nid(value);
        if (nid == NID_undef) {
            ERR_raise(ERR_LIB_EC, EC_R_INVALID_CURVE);
            return 0;
        }
        return EVP_PKEY_CTX_set_ec_paramgen_curve_nid(ctx, nid);
    } else if (strcmp(type, "ec_param_enc") == 0) {
        int param_enc;
        if (strcmp(value, "explicit") == 0)
            param_enc = 0;
        else if (strcmp(value, "named_curve") == 0)
            param_enc = OPENSSL_EC_NAMED_CURVE;
        else
            return -2;
        return EVP_PKEY_CTX_set_ec_param_enc(ctx, param_enc);
    } else if (strcmp(type, "ecdh_kdf_md") == 0) {
        const EVP_MD *md;
        if ((md = EVP_get_digestbyname(value)) == NULL) {
            ERR_raise(ERR_LIB_EC, EC_R_INVALID_DIGEST);
            return 0;
        }
        return EVP_PKEY_CTX_set_ecdh_kdf_md(ctx, md);
    } else if (strcmp(type, "ecdh_cofactor_mode") == 0) {
        int co_mode;
        co_mode = atoi(value);
        return EVP_PKEY_CTX_set_ecdh_cofactor_mode(ctx, co_mode);
    }

    return -2;
}